

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O1

void __thiscall
data_structures::
SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
::~SymbolTable(SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
               *this)

{
  size_t *psVar1;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar2;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_1;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  
  this->_vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010dab8;
  pLVar3 = (this->_list)._header;
  if (pLVar3 != (this->_list)._tail) {
    do {
      pLVar2 = pLVar3->_next;
      if (pLVar2 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        pLVar3->_next = pLVar2->_next;
        (*pLVar2->_vptr_ListNode[1])(pLVar2);
      }
      if (pLVar2 == (this->_list)._tail) {
        (this->_list)._tail = pLVar3;
      }
      psVar1 = &(this->_list)._size;
      *psVar1 = *psVar1 - 1;
      pLVar3 = (this->_list)._header;
    } while (pLVar3 != (this->_list)._tail);
  }
  (this->_list)._tail = pLVar3;
  (this->_list)._size = 0;
  (this->_list)._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dae8;
  pLVar2 = (this->_list)._header;
  if (pLVar2 != pLVar3) {
    do {
      pLVar3 = pLVar2->_next;
      if (pLVar3 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        pLVar2->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
      }
      if (pLVar3 == (this->_list)._tail) {
        (this->_list)._tail = pLVar2;
      }
      psVar1 = &(this->_list)._size;
      *psVar1 = *psVar1 - 1;
      pLVar2 = (this->_list)._header;
    } while (pLVar2 != (this->_list)._tail);
  }
  if (pLVar2 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)0x0) {
    (*pLVar2->_vptr_ListNode[1])(pLVar2);
  }
  (this->_list)._header =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (this->_list)._tail =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (this->_list)._size = 0;
  operator_delete(this,0x28);
  return;
}

Assistant:

inline
    SymbolTable<Key, Value>::~SymbolTable() {
        _list.clear();
    }